

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_operation.cc
# Opt level: O2

bool __thiscall
sptk::ScalarOperation::Run(ScalarOperation *this,double *number,bool *is_magic_number)

{
  int iVar1;
  pointer ppMVar2;
  bool bVar3;
  
  if (is_magic_number == (bool *)0x0 || number == (double *)0x0) {
    bVar3 = false;
  }
  else {
    *is_magic_number = false;
    ppMVar2 = (this->modules_).
              super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      bVar3 = ppMVar2 ==
              (this->modules_).
              super__Vector_base<sptk::ScalarOperation::ModuleInterface_*,_std::allocator<sptk::ScalarOperation::ModuleInterface_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar3) {
        return bVar3;
      }
      iVar1 = (*(*ppMVar2)->_vptr_ModuleInterface[2])(*ppMVar2,number,is_magic_number);
      ppMVar2 = ppMVar2 + 1;
    } while ((char)iVar1 != '\0');
  }
  return bVar3;
}

Assistant:

bool ScalarOperation::Run(double* number, bool* is_magic_number) const {
  if (NULL == number || NULL == is_magic_number) {
    return false;
  }

  *is_magic_number = false;
  for (std::vector<ScalarOperation::ModuleInterface*>::const_iterator itr(
           modules_.begin());
       itr != modules_.end(); ++itr) {
    if (!(*itr)->Run(number, is_magic_number)) {
      return false;
    }
  }

  return true;
}